

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

void fmt::v9::detail::vformat_to<char>
               (buffer<char> *buf,text_style *ts,basic_string_view<char> format_str,
               basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args)

{
  emphasis em;
  size_t sVar1;
  color_type cVar2;
  bool bVar3;
  bool bVar4;
  ansi_color_escape<char> emphasis;
  ansi_color_escape<char> local_50;
  
  bVar3 = ts->ems == ~(strikethrough|conceal|reverse|blink|underline|italic|faint|bold);
  if (!bVar3) {
    em = text_style::get_emphasis(ts);
    ansi_color_escape<char>::ansi_color_escape(&local_50,em);
    sVar1 = strlen(local_50.buffer);
    buffer<char>::append<char>(buf,local_50.buffer,local_50.buffer + sVar1);
  }
  bVar4 = ts->set_foreground_color != true;
  if (!bVar4) {
    cVar2 = text_style::get_foreground(ts);
    ansi_color_escape<char>::ansi_color_escape(&local_50,cVar2,"\x1b[38;2;");
    sVar1 = strlen(local_50.buffer);
    buffer<char>::append<char>(buf,local_50.buffer,local_50.buffer + sVar1);
  }
  if (ts->set_background_color == true) {
    cVar2 = text_style::get_background(ts);
    ansi_color_escape<char>::ansi_color_escape(&local_50,cVar2,"\x1b[48;2;");
    sVar1 = strlen(local_50.buffer);
    buffer<char>::append<char>(buf,local_50.buffer,local_50.buffer + sVar1);
    vformat_to<char>(buf,format_str,args,(locale_ref)0x0);
  }
  else {
    vformat_to<char>(buf,format_str,args,(locale_ref)0x0);
    if (bVar4 && bVar3) {
      return;
    }
  }
  buffer<char>::append<char>(buf,"\x1b[0m","");
  return;
}

Assistant:

void vformat_to(buffer<Char>& buf, const text_style& ts,
                basic_string_view<Char> format_str,
                basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  bool has_style = false;
  if (ts.has_emphasis()) {
    has_style = true;
    auto emphasis = detail::make_emphasis<Char>(ts.get_emphasis());
    buf.append(emphasis.begin(), emphasis.end());
  }
  if (ts.has_foreground()) {
    has_style = true;
    auto foreground = detail::make_foreground_color<Char>(ts.get_foreground());
    buf.append(foreground.begin(), foreground.end());
  }
  if (ts.has_background()) {
    has_style = true;
    auto background = detail::make_background_color<Char>(ts.get_background());
    buf.append(background.begin(), background.end());
  }
  detail::vformat_to(buf, format_str, args, {});
  if (has_style) detail::reset_color<Char>(buf);
}